

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t utf8_to_unicode(uint32_t *pwc,char *s,size_t n)

{
  wchar_t cnt;
  size_t n_local;
  char *s_local;
  uint32_t *pwc_local;
  
  pwc_local._4_4_ = _utf8_to_unicode(pwc,s,n);
  if (((pwc_local._4_4_ == L'\x03') && (0xd7ff < *pwc)) && (*pwc < 0xe000)) {
    pwc_local._4_4_ = L'\xfffffffd';
  }
  return pwc_local._4_4_;
}

Assistant:

static int
utf8_to_unicode(uint32_t *pwc, const char *s, size_t n)
{
	int cnt;

	cnt = _utf8_to_unicode(pwc, s, n);
	/* Any of Surrogate pair is not leagal Unicode values. */
	if (cnt == 3 && IS_SURROGATE_PAIR_LA(*pwc))
		return (-3);
	return (cnt);
}